

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_hop(t_sigmund *x,t_floatarg f)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = (uint)f;
  if ((int)uVar4 < 0) {
    pd_error((void *)0x0,"sigmund~: ignoring negative hopsize %d");
    return;
  }
  x->x_hop = uVar4;
  if (uVar4 != 0) {
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    if (1 << ((byte)iVar2 & 0x1f) != uVar4) {
      bVar3 = 0xff;
      do {
        bVar3 = bVar3 + 1;
        bVar1 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar1);
      x->x_hop = 1 << (bVar3 & 0x1f);
      post("sigmund~: adjusting analysis size to %d points");
      return;
    }
  }
  return;
}

Assistant:

static void sigmund_hop(t_sigmund *x, t_floatarg f)
{
    int hop = f;
    if (hop < 0)
    {
        pd_error(0, "sigmund~: ignoring negative hopsize %d", hop);
        return;
    }
    x->x_hop = hop;
    if (0 == hop) return;
        /* check parameter ranges */
    if (x->x_hop != (1 << sigmund_ilog2(x->x_hop)))
        post("sigmund~: adjusting analysis size to %d points",
            (x->x_hop = (1 << sigmund_ilog2(x->x_hop))));
}